

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O0

NodeData * __thiscall IndexTree::search(IndexTree *this,PolarString *key)

{
  long lVar1;
  int iVar2;
  long *__s1;
  long *__s2;
  PolarString *in_RSI;
  long in_RDI;
  int result;
  int32_t current;
  int result_1;
  int64_t fast_result;
  int64_t *fast_that;
  int64_t *fast_this;
  int local_68;
  uint local_64;
  int local_54;
  IndexData *local_40;
  uint local_4;
  
  local_54 = **(int **)(in_RDI + 0x28);
  while (local_54 != -1) {
    __s1 = (long *)polar_race::PolarString::data(in_RSI);
    __s2 = (long *)(*(long *)(in_RDI + 0x30) + (long)local_54 * 0x41c);
    lVar1 = *__s2;
    if (*__s1 == lVar1) {
      iVar2 = strcmp((char *)__s1,(char *)__s2);
      if (iVar2 < 0) {
        local_64 = 0xffffffff;
      }
      else {
        local_64 = (uint)(0 < iVar2);
      }
      local_4 = local_64;
    }
    else {
      local_4 = 1;
      if (*__s1 - lVar1 < 0) {
        local_4 = 0xffffffff;
      }
    }
    if (local_4 == 0) break;
    if ((int)local_4 < 0) {
      local_68 = *(int *)(*(long *)(in_RDI + 0x30) + (long)local_54 * 0x41c + 0x414);
    }
    else {
      local_68 = *(int *)(*(long *)(in_RDI + 0x30) + (long)local_54 * 0x41c + 0x418);
    }
    local_54 = local_68;
  }
  if (local_54 == -1) {
    local_40 = &INDEX_NOT_FOUND;
  }
  else {
    local_40 = (IndexData *)(*(long *)(in_RDI + 0x30) + (long)local_54 * 0x41c + 0x404);
  }
  return local_40;
}

Assistant:

const IndexTree::NodeData &IndexTree::search(const PolarString &key) {
    auto current = *root_node;
    while (current != -1) {
        auto result = fast_string_cmp(key.data(), nodes[current].key);
        if (result == 0) break;
        current = result < 0 ? nodes[current].left : nodes[current].right;
    }
    if (__glibc_unlikely(current == -1)) return INDEX_NOT_FOUND;
    else return nodes[current].data;
}